

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O1

void __thiscall icu_63::CurrencyPluralInfo::deleteHash(CurrencyPluralInfo *this,Hashtable *hTable)

{
  UHashElement *pUVar1;
  int32_t *pos_00;
  int32_t pos;
  int32_t local_14;
  
  if (hTable != (Hashtable *)0x0) {
    pos_00 = &local_14;
    pUVar1 = uhash_nextElement_63(hTable->hash,pos_00);
    if (pUVar1 != (UHashElement *)0x0) {
      do {
        if ((long *)(pUVar1->value).pointer != (long *)0x0) {
          (**(code **)(*(pUVar1->value).pointer + 8))();
        }
        pos_00 = &local_14;
        pUVar1 = uhash_nextElement_63(hTable->hash,&local_14);
      } while (pUVar1 != (UHashElement *)0x0);
    }
    if (hTable->hash != (UHashtable *)0x0) {
      uhash_close_63(hTable->hash);
    }
    UMemory::operator_delete((UMemory *)hTable,pos_00);
  }
  return;
}

Assistant:

void
CurrencyPluralInfo::deleteHash(Hashtable* hTable) {
    if ( hTable == nullptr ) {
        return;
    }
    int32_t pos = UHASH_FIRST;
    const UHashElement* element = nullptr;
    while ( (element = hTable->nextElement(pos)) != nullptr ) {
        const UHashTok valueTok = element->value;
        const UnicodeString* value = (UnicodeString*)valueTok.pointer;
        delete value;
    }
    delete hTable;
    hTable = nullptr;
}